

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

__m128i highbd_clamp_epi16(__m128i u,int bd)

{
  longlong in_RAX;
  undefined4 in_register_00000014;
  undefined1 in_XMM2 [16];
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  alVar2[1]._4_4_ = in_register_00000014;
  alVar2[1]._0_4_ = bd;
  auVar1 = pmovsxbw(in_XMM2,0x101010101010101);
  psllw(auVar1,ZEXT416((uint)u[0]));
  alVar2[0] = in_RAX;
  return alVar2;
}

Assistant:

static inline __m128i highbd_clamp_epi16(__m128i u, int bd) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i max = _mm_sub_epi16(_mm_slli_epi16(one, bd), one);
  __m128i clamped, mask;

  mask = _mm_cmpgt_epi16(u, max);
  clamped = _mm_andnot_si128(mask, u);
  mask = _mm_and_si128(mask, max);
  clamped = _mm_or_si128(mask, clamped);
  mask = _mm_cmpgt_epi16(clamped, zero);
  clamped = _mm_and_si128(clamped, mask);

  return clamped;
}